

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_get_key_exchange_md_tls1_2
              (mbedtls_ssl_context *ssl,uchar *hash,size_t *hashlen,uchar *data,size_t data_len,
              mbedtls_md_type_t md_alg)

{
  void *ilen;
  byte bVar1;
  int ret;
  mbedtls_md_info_t *md_info;
  int line;
  char *text;
  undefined1 local_50 [8];
  mbedtls_md_context_t ctx;
  
  ctx.hmac_ctx = (void *)data_len;
  md_info = mbedtls_md_info_from_type(md_alg);
  bVar1 = mbedtls_md_get_size(md_info);
  *hashlen = (ulong)bVar1;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x2216,"Perform mbedtls-based computation of digest of ServerKeyExchange");
  mbedtls_md_init((mbedtls_md_context_t *)local_50);
  ret = mbedtls_md_setup((mbedtls_md_context_t *)local_50,md_info,0);
  ilen = ctx.hmac_ctx;
  if (ret == 0) {
    ret = mbedtls_md_starts((mbedtls_md_context_t *)local_50);
    if (ret == 0) {
      ret = mbedtls_md_update((mbedtls_md_context_t *)local_50,ssl->handshake->randbytes,0x40);
      if (ret == 0) {
        ret = mbedtls_md_update((mbedtls_md_context_t *)local_50,data,(size_t)ilen);
        if (ret == 0) {
          ret = mbedtls_md_finish((mbedtls_md_context_t *)local_50,hash);
          if (ret == 0) {
            ret = 0;
            goto LAB_0020af31;
          }
          text = "mbedtls_md_finish";
          line = 0x2232;
        }
        else {
          text = "mbedtls_md_update";
          line = 0x222e;
        }
      }
      else {
        text = "mbedtls_md_update";
        line = 0x222a;
      }
    }
    else {
      text = "mbedtls_md_starts";
      line = 0x2226;
    }
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,line,text,ret);
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x2222,"mbedtls_md_setup",ret);
  }
LAB_0020af31:
  mbedtls_md_free((mbedtls_md_context_t *)local_50);
  if (ret != 0) {
    mbedtls_ssl_send_alert_message(ssl,'\x02','P');
  }
  return ret;
}

Assistant:

int mbedtls_ssl_get_key_exchange_md_tls1_2(mbedtls_ssl_context *ssl,
                                           unsigned char *hash, size_t *hashlen,
                                           unsigned char *data, size_t data_len,
                                           mbedtls_md_type_t md_alg)
{
    int ret = 0;
    mbedtls_md_context_t ctx;
    const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type(md_alg);
    *hashlen = mbedtls_md_get_size(md_info);

    MBEDTLS_SSL_DEBUG_MSG(3, ("Perform mbedtls-based computation of digest of ServerKeyExchange"));

    mbedtls_md_init(&ctx);

    /*
     * digitally-signed struct {
     *     opaque client_random[32];
     *     opaque server_random[32];
     *     ServerDHParams params;
     * };
     */
    if ((ret = mbedtls_md_setup(&ctx, md_info, 0)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_md_setup", ret);
        goto exit;
    }
    if ((ret = mbedtls_md_starts(&ctx)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_md_starts", ret);
        goto exit;
    }
    if ((ret = mbedtls_md_update(&ctx, ssl->handshake->randbytes, 64)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_md_update", ret);
        goto exit;
    }
    if ((ret = mbedtls_md_update(&ctx, data, data_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_md_update", ret);
        goto exit;
    }
    if ((ret = mbedtls_md_finish(&ctx, hash)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_md_finish", ret);
        goto exit;
    }

exit:
    mbedtls_md_free(&ctx);

    if (ret != 0) {
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR);
    }

    return ret;
}